

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hbtrie.cc
# Opt level: O0

hbtrie_result hbtrie_last(hbtrie_iterator *it)

{
  void *pvVar1;
  byte *in_RDI;
  hbtrie_iterator temp;
  hbtrie_iterator *in_stack_ffffffffffffff60;
  
  memcpy(&stack0xffffffffffffff60,in_RDI,0x98);
  hbtrie_iterator_free(in_stack_ffffffffffffff60);
  memcpy(in_RDI,&stack0xffffffffffffff60,0x70);
  pvVar1 = malloc((ulong)*in_RDI);
  *(void **)(in_RDI + 0x68) = pvVar1;
  memset(*(void **)(in_RDI + 0x68),0xff,(ulong)*in_RDI);
  pvVar1 = malloc(0x10000);
  *(void **)(in_RDI + 0x80) = pvVar1;
  memset(*(void **)(in_RDI + 0x80),0xff,(ulong)*in_RDI);
  *(ulong *)(in_RDI + 0x88) = (ulong)*in_RDI;
  list_init((list *)(in_RDI + 0x70));
  in_RDI[0x90] = 0;
  return HBTRIE_RESULT_SUCCESS;
}

Assistant:

hbtrie_result hbtrie_last(struct hbtrie_iterator *it)
{
    struct hbtrie_iterator temp;

    temp = *it;
    hbtrie_iterator_free(it);

    it->trie = temp.trie;
    // MUST NOT affect the original trie due to sharing the same memory segment
    it->trie.last_map_chunk = (void *)malloc(it->trie.chunksize);
    memset(it->trie.last_map_chunk, 0xff, it->trie.chunksize);

    it->curkey = (void *)malloc(HBTRIE_MAX_KEYLEN);
    // init with the infinite (0xff..) key without reforming
    memset(it->curkey, 0xff, it->trie.chunksize);
    it->keylen = it->trie.chunksize;

    list_init(&it->btreeit_list);
    it->flags = 0;

    return HBTRIE_RESULT_SUCCESS;
}